

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<bool>::data(QList<bool> *this)

{
  QArrayDataPointer<bool> *this_00;
  bool *pbVar1;
  QArrayDataPointer<bool> *in_RDI;
  
  detach((QList<bool> *)0x78f3ec);
  this_00 = (QArrayDataPointer<bool> *)QArrayDataPointer<bool>::operator->(in_RDI);
  pbVar1 = QArrayDataPointer<bool>::data(this_00);
  return pbVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }